

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::~CTcTokenizer(CTcTokenizer *this)

{
  void *pvVar1;
  undefined8 uVar2;
  CTcTokFileDesc *pCVar3;
  CTcTokenEle *pCVar4;
  long in_RDI;
  CTcMacroRsc *nxt_4;
  tctok_incpath_t *nxt_3;
  tctok_incfile_t *nxt_2;
  CTcTokenEle *nxt_1;
  CTcTokFileDesc *nxt;
  CTcTokSrcBlock *in_stack_ffffffffffffff80;
  CTcTokString *this_00;
  CTcTokenizer *in_stack_ffffffffffffff90;
  CVmHashTable *this_01;
  
  delete_source(in_stack_ffffffffffffff90);
  if ((*(long *)(in_RDI + 0xd58) != 0) && (*(long **)(in_RDI + 0xd58) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0xd58) + 8))();
  }
  while (*(long *)(in_RDI + 0x60) != 0) {
    pCVar3 = CTcTokFileDesc::get_next(*(CTcTokFileDesc **)(in_RDI + 0x60));
    pvVar1 = *(void **)(in_RDI + 0x60);
    if (pvVar1 != (void *)0x0) {
      CTcTokFileDesc::~CTcTokFileDesc((CTcTokFileDesc *)in_stack_ffffffffffffff80);
      operator_delete(pvVar1,0x58);
    }
    *(CTcTokFileDesc **)(in_RDI + 0x60) = pCVar3;
  }
  *(undefined8 *)(in_RDI + 0xd20) = 0;
  while (*(long *)(in_RDI + 0xd18) != 0) {
    pCVar4 = CTcTokenEle::getnxt(*(CTcTokenEle **)(in_RDI + 0xd18));
    if (*(void **)(in_RDI + 0xd18) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 0xd18),0x38);
    }
    *(CTcTokenEle **)(in_RDI + 0xd18) = pCVar4;
  }
  if (*(long *)(in_RDI + 0x70) != 0) {
    free(*(void **)(in_RDI + 0x70));
  }
  lib_free_str((char *)0x2e2f02);
  CCharmap::release_ref((CCharmap *)in_stack_ffffffffffffff80);
  while (*(long *)(in_RDI + 0x20) != 0) {
    uVar2 = **(undefined8 **)(in_RDI + 0x20);
    free(*(void **)(in_RDI + 0x20));
    *(undefined8 *)(in_RDI + 0x20) = uVar2;
  }
  while (*(long *)(in_RDI + 0x28) != 0) {
    uVar2 = **(undefined8 **)(in_RDI + 0x28);
    free(*(void **)(in_RDI + 0x28));
    *(undefined8 *)(in_RDI + 0x28) = uVar2;
  }
  while (*(long *)(in_RDI + 0xd48) != 0) {
    uVar2 = *(undefined8 *)(*(long *)(in_RDI + 0xd48) + 0x68);
    pvVar1 = *(void **)(in_RDI + 0xd48);
    if (pvVar1 != (void *)0x0) {
      CTcMacroRsc::~CTcMacroRsc((CTcMacroRsc *)in_stack_ffffffffffffff80);
      operator_delete(pvVar1,0x70);
    }
    *(undefined8 *)(in_RDI + 0xd48) = uVar2;
  }
  this_01 = *(CVmHashTable **)(in_RDI + 0xca8);
  if (this_01 != (CVmHashTable *)0x0) {
    CTcTokSrcBlock::~CTcTokSrcBlock(in_stack_ffffffffffffff80);
    operator_delete(this_01,0xc358);
  }
  if (*(long **)(in_RDI + 0xd30) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0xd30) + 8))();
  }
  this_00 = *(CTcTokString **)(in_RDI + 0xd38);
  if (this_00 != (CTcTokString *)0x0) {
    CVmHashTable::~CVmHashTable(this_01);
    operator_delete(this_00,0x20);
  }
  pvVar1 = *(void **)(in_RDI + 0xd40);
  if (pvVar1 != (void *)0x0) {
    CVmHashTable::~CVmHashTable(this_01);
    operator_delete(pvVar1,0x20);
  }
  if (*(long *)(in_RDI + 0xd60) != 0) {
    CCharmap::release_ref((CCharmap *)this_00);
  }
  CTcTokString::~CTcTokString(this_00);
  CTcTokString::~CTcTokString(this_00);
  CTcTokString::~CTcTokString(this_00);
  CTcTokString::~CTcTokString(this_00);
  return;
}

Assistant:

CTcTokenizer::~CTcTokenizer()
{
    /* delete all streams */
    delete_source();

    /* delete the string capture file */
    if (string_fp_ != 0)
        delete string_fp_;

    /* delete all file descriptors */
    while (desc_head_ != 0)
    {
        /* remember the next descriptor */
        CTcTokFileDesc *nxt = desc_head_->get_next();

        /* delete this one */
        delete desc_head_;

        /* move on to the next one */
        desc_head_ = nxt;
    }

    /* delete the unget list */
    unget_cur_ = 0;
    while (unget_head_ != 0)
    {
        /* remember the next element */
        CTcTokenEle *nxt = unget_head_->getnxt();

        /* delete this element */
        delete unget_head_;

        /* advance to the next element */
        unget_head_ = nxt;
    }

    /* delete the file descriptor index array */
    if (desc_list_ != 0)
        t3free(desc_list_);

    /* delete our default character set string copy */
    lib_free_str(default_charset_);

    /* release our reference on our default character mapper */
    default_mapper_->release_ref();

    /* forget about all of our previous include files */
    while (prev_includes_ != 0)
    {
        tctok_incfile_t *nxt;

        /* remember the next file */
        nxt = prev_includes_->nxt;

        /* delete this one */
        t3free(prev_includes_);

        /* move on to the next one */
        prev_includes_ = nxt;
    }

    /* delete the include path list */
    while (incpath_head_ != 0)
    {
        tctok_incpath_t *nxt;

        /* remember the next entry in the path */
        nxt = incpath_head_->nxt;

        /* delete this entry */
        t3free(incpath_head_);

        /* move on to the next one */
        incpath_head_ = nxt;
    }

    /* delete the macro resources */
    while (macro_res_head_ != 0)
    {
        CTcMacroRsc *nxt;

        /* remember the next one */
        nxt = macro_res_head_->next_;

        /* delete this one */
        delete macro_res_head_;

        /* move on to the next one */
        macro_res_head_ = nxt;
    }

    /* delete the token list */
    delete src_head_;

    /* delete the #define and #undef symbol tables */
    delete defines_;
    delete undefs_;

    /* delete the keyword hash table */
    delete kw_;

    /* if we created a mapping for the string capture file, release it */
    if (string_fp_map_ != 0)
        string_fp_map_->release_ref();
}